

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<CLIArguments::Rename,_8UL>::push_back
          (SmallVector<CLIArguments::Rename,_8UL> *this,Rename *t)

{
  Rename *t_local;
  SmallVector<CLIArguments::Rename,_8UL> *this_local;
  
  reserve(this,(this->super_VectorView<CLIArguments::Rename>).buffer_size + 1);
  CLIArguments::Rename::Rename
            ((this->super_VectorView<CLIArguments::Rename>).ptr +
             (this->super_VectorView<CLIArguments::Rename>).buffer_size,t);
  (this->super_VectorView<CLIArguments::Rename>).buffer_size =
       (this->super_VectorView<CLIArguments::Rename>).buffer_size + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}